

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

Branch * __thiscall
soul::PoolAllocator::allocate<soul::heart::Branch,soul::heart::Block&>
          (PoolAllocator *this,Block *args)

{
  PoolItem *pPVar1;
  
  pPVar1 = allocateSpaceForObject(this,0x58);
  *(undefined8 *)&pPVar1->field_0x18 = 0;
  pPVar1[1].size = 0;
  pPVar1->item = &PTR__Branch_00332df0;
  pPVar1[1].destructor = (DestructorFn *)args;
  pPVar1[1].item = &pPVar1[2].destructor;
  *(undefined8 *)&pPVar1[1].field_0x18 = 0;
  pPVar1[2].size = 4;
  pPVar1->destructor =
       allocate<soul::heart::Branch,_soul::heart::Block_&>::anon_class_1_0_00000001::__invoke;
  return (Branch *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }